

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

int64_t icu_63::FixedDecimal::getFractionalDigits(double n,int32_t v)

{
  UBool UVar1;
  int64_t iVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = floor(n);
  iVar2 = 0;
  if (v != 0) {
    if ((dVar3 != n) || (NAN(dVar3) || NAN(n))) {
      UVar1 = uprv_isNaN_63(n);
      if ((UVar1 == '\0') && (UVar1 = uprv_isPositiveInfinity_63(n), UVar1 == '\0')) {
        dVar3 = floor(ABS(n));
        dVar3 = ABS(n) - dVar3;
        if (v == 3) {
          dVar3 = dVar3 * 1000.0;
        }
        else if (v == 2) {
          dVar3 = dVar3 * 100.0;
        }
        else {
          if (v != 1) {
            dVar4 = pow(10.0,(double)v);
            dVar3 = floor(dVar4 * dVar3 + 0.5);
            if (9.223372036854776e+18 < dVar3) {
              return 0x7fffffffffffffff;
            }
            return (long)dVar3;
          }
          dVar3 = dVar3 * 10.0;
        }
        iVar2 = (int64_t)(dVar3 + 0.5);
      }
      else {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int64_t FixedDecimal::getFractionalDigits(double n, int32_t v) {
    if (v == 0 || n == floor(n) || uprv_isNaN(n) || uprv_isPositiveInfinity(n)) {
        return 0;
    }
    n = fabs(n);
    double fract = n - floor(n);
    switch (v) {
      case 1: return (int64_t)(fract*10.0 + 0.5);
      case 2: return (int64_t)(fract*100.0 + 0.5);
      case 3: return (int64_t)(fract*1000.0 + 0.5);
      default:
          double scaled = floor(fract * pow(10.0, (double)v) + 0.5);
          if (scaled > U_INT64_MAX) {
              return U_INT64_MAX;
          } else {
              return (int64_t)scaled;
          }
      }
}